

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_imgui.h
# Opt level: O1

void simgui_render(void)

{
  size_t __n;
  float fVar1;
  float fVar2;
  int iVar3;
  ImDrawList *pIVar4;
  ImDrawCmd *pIVar5;
  code *pcVar6;
  ImTextureID pvVar7;
  size_t __n_00;
  bool bVar8;
  float fVar9;
  void *pvVar10;
  size_t sVar11;
  void *pvVar12;
  size_t sVar13;
  ImDrawData *pIVar14;
  ImGuiIO *pIVar15;
  int iVar16;
  int iVar17;
  wchar_t base_element;
  wchar_t wVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  wchar_t height;
  _simgui_vs_params_t vs_params;
  sg_bindings bind;
  ImTextureID local_138;
  sg_range local_118;
  ImVec2 local_108;
  undefined8 uStack_100;
  sg_range local_f8;
  undefined8 local_e8;
  ulong uStack_e0;
  int local_c4;
  sg_buffer local_a4;
  int local_a0;
  sg_image local_6c;
  
  igRender();
  pIVar14 = igGetDrawData();
  pIVar15 = igGetIO();
  sVar13 = _simgui.indices.size;
  pvVar12 = _simgui.indices.ptr;
  sVar11 = _simgui.vertices.size;
  pvVar10 = _simgui.vertices.ptr;
  if ((pIVar14 != (ImDrawData *)0x0) && (pIVar14->CmdListsCount != 0)) {
    if (pIVar14->CmdListsCount < 1) {
      lVar24 = 0;
      uVar21 = 0;
      uVar22 = 0;
    }
    else {
      lVar24 = 0;
      uVar19 = 0;
      uVar20 = 0;
      do {
        pIVar4 = pIVar14->CmdLists[lVar24];
        iVar23 = (pIVar4->VtxBuffer).Size;
        __n_00 = (long)iVar23 * 0x14;
        uVar22 = __n_00 + uVar19;
        if (sVar11 < uVar22) {
          bVar8 = false;
          uVar22 = uVar19;
          uVar21 = uVar20;
        }
        else {
          wVar18 = (pIVar4->IdxBuffer).Size;
          __n = (long)wVar18 * 2;
          uVar21 = __n + uVar20;
          if (sVar13 < uVar21) {
            bVar8 = false;
            uVar22 = uVar19;
            uVar21 = uVar20;
          }
          else {
            if (iVar23 != 0) {
              memcpy((void *)(uVar19 + (long)pvVar10),(pIVar4->VtxBuffer).Data,__n_00);
            }
            bVar8 = true;
            if (wVar18 != L'\0') {
              memcpy((void *)(uVar20 + (long)pvVar12),(pIVar4->IdxBuffer).Data,__n);
            }
          }
        }
      } while ((bVar8) &&
              (lVar24 = lVar24 + 1, uVar19 = uVar22, uVar20 = uVar21,
              lVar24 < pIVar14->CmdListsCount));
    }
    iVar23 = (int)lVar24;
    if (iVar23 != 0) {
      if (_sg.valid == false) {
        __assert_fail("_sg.valid",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                      ,0x3c9b,"void sg_push_debug_group(const char *)");
      }
      if (uVar22 != 0) {
        uStack_e0 = uVar22;
        local_e8 = _simgui.vertices.ptr;
        sg_update_buffer(_simgui.vbuf,(sg_range *)&local_e8);
      }
      if (uVar21 != 0) {
        uStack_e0 = uVar21;
        local_e8 = _simgui.indices.ptr;
        sg_update_buffer(_simgui.ibuf,(sg_range *)&local_e8);
      }
      fVar9 = _simgui.desc.dpi_scale;
      wVar18 = (wchar_t)((pIVar15->DisplaySize).x * _simgui.desc.dpi_scale);
      height = (wchar_t)((pIVar15->DisplaySize).y * _simgui.desc.dpi_scale);
      uVar22 = 0;
      sg_apply_viewport(L'\0',L'\0',wVar18,height,true);
      sg_apply_scissor_rect(L'\0',L'\0',wVar18,height,true);
      sg_apply_pipeline(_simgui.pip);
      local_f8.ptr = &local_108;
      uStack_100 = 0;
      local_108 = pIVar15->DisplaySize;
      local_f8.size = 0x10;
      sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',&local_f8);
      memset(&local_e8,0,0xb0);
      local_e8._4_4_ = _simgui.vbuf.id;
      local_a4.id = _simgui.ibuf.id;
      local_138 = pIVar15->Fonts->TexID;
      local_6c.id = (uint32_t)local_138;
      iVar16 = 0;
      iVar17 = 0;
      do {
        pIVar4 = pIVar14->CmdLists[uVar22];
        local_c4 = iVar16;
        local_a0 = iVar17;
        sg_apply_bindings((sg_bindings *)&local_e8);
        lVar24 = (long)(pIVar4->CmdBuffer).Size;
        if (0 < lVar24) {
          lVar25 = 0;
          iVar3 = 0;
          base_element = L'\0';
          do {
            pIVar5 = (pIVar4->CmdBuffer).Data;
            pcVar6 = *(code **)((long)&pIVar5->UserCallback + lVar25);
            if (pcVar6 == (code *)0x0) {
              pvVar7 = *(ImTextureID *)((long)&pIVar5->TextureId + lVar25);
              if ((local_138 != pvVar7) || (iVar3 != *(int *)((long)&pIVar5->VtxOffset + lVar25))) {
                iVar3 = *(int *)((long)&pIVar5->VtxOffset + lVar25);
                local_6c.id = (uint32_t)pvVar7;
                local_c4 = iVar16 + iVar3 * 0x14;
                sg_apply_bindings((sg_bindings *)&local_e8);
                local_138 = pvVar7;
              }
              fVar1 = *(float *)((long)&(pIVar5->ClipRect).x + lVar25);
              fVar2 = *(float *)((long)&(pIVar5->ClipRect).y + lVar25);
              sg_apply_scissor_rect
                        ((int)(fVar9 * fVar1),(int)(fVar9 * fVar2),
                         (int)((*(float *)((long)&(pIVar5->ClipRect).z + lVar25) - fVar1) * fVar9),
                         (int)((*(float *)((long)&(pIVar5->ClipRect).w + lVar25) - fVar2) * fVar9),
                         true);
              sg_draw(base_element,*(wchar_t *)((long)&pIVar5->ElemCount + lVar25),L'\x01');
            }
            else {
              (*pcVar6)();
              sg_apply_viewport(L'\0',L'\0',wVar18,height,true);
              sg_apply_pipeline(_simgui.pip);
              local_118.ptr = &local_108;
              local_118.size = 0x10;
              sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',&local_118);
              sg_apply_bindings((sg_bindings *)&local_e8);
            }
            base_element = base_element + *(int *)((long)&pIVar5->ElemCount + lVar25);
            lVar25 = lVar25 + 0x38;
          } while (lVar24 * 0x38 - lVar25 != 0);
        }
        iVar16 = iVar16 + (pIVar4->VtxBuffer).Size * 0x14;
        iVar17 = iVar17 + (pIVar4->IdxBuffer).Size * 2;
        uVar22 = uVar22 + 1;
      } while (uVar22 != iVar23 + (uint)(iVar23 == 0));
      sg_apply_viewport(L'\0',L'\0',wVar18,height,true);
      sg_apply_scissor_rect(L'\0',L'\0',wVar18,height,true);
      if (_sg.valid == false) {
        __assert_fail("_sg.valid",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                      ,0x3ca2,"void sg_pop_debug_group(void)");
      }
    }
  }
  return;
}

Assistant:

SOKOL_API_IMPL void simgui_render(void) {
    #if defined(__cplusplus)
        ImGui::Render();
        ImDrawData* draw_data = ImGui::GetDrawData();
        ImGuiIO* io = &ImGui::GetIO();
    #else
        igRender();
        ImDrawData* draw_data = igGetDrawData();
        ImGuiIO* io = igGetIO();
    #endif
    if (0 == draw_data) {
        return;
    }
    if (draw_data->CmdListsCount == 0) {
        return;
    }
    /* copy vertices and indices into an intermediate buffer so that
       they can be updated with a single sg_update_buffer() call each
       (sg_append_buffer() has performance problems on some GL platforms),
       also keep track of valid number of command lists in case of a
       buffer overflow
    */
    size_t all_vtx_size = 0;
    size_t all_idx_size = 0;
    int cmd_list_count = 0;
    for (int cl_index = 0; cl_index < draw_data->CmdListsCount; cl_index++, cmd_list_count++) {
        ImDrawList* cl = draw_data->CmdLists[cl_index];
        const size_t vtx_size = (size_t)cl->VtxBuffer.Size * sizeof(ImDrawVert);
        const size_t idx_size = (size_t)cl->IdxBuffer.Size * sizeof(ImDrawIdx);

        /* check for buffer overflow */
        if (((all_vtx_size + vtx_size) > _simgui.vertices.size) ||
            ((all_idx_size + idx_size) > _simgui.indices.size))
        {
            break;
        }

        /* copy vertices and indices into common buffers */
        if (vtx_size > 0) {
            const ImDrawVert* src_vtx_ptr = cl->VtxBuffer.Data;
            void* dst_vtx_ptr = (void*) (((uint8_t*)_simgui.vertices.ptr) + all_vtx_size);
            memcpy(dst_vtx_ptr, src_vtx_ptr, vtx_size);
        }
        if (idx_size > 0) {
            const ImDrawIdx* src_idx_ptr = cl->IdxBuffer.Data;
            void* dst_idx_ptr = (void*) (((uint8_t*)_simgui.indices.ptr) + all_idx_size);
            memcpy(dst_idx_ptr, src_idx_ptr, idx_size);
        }
        all_vtx_size += vtx_size;
        all_idx_size += idx_size;
    }
    if (0 == cmd_list_count) {
        return;
    }

    /* update the sokol-gfx vertex- and index-buffer */
    sg_push_debug_group("sokol-imgui");
    if (all_vtx_size > 0) {
        sg_range vtx_data = _simgui.vertices;
        vtx_data.size = all_vtx_size;
        sg_update_buffer(_simgui.vbuf, &vtx_data);
    }
    if (all_idx_size > 0) {
        sg_range idx_data = _simgui.indices;
        idx_data.size = all_idx_size;
        sg_update_buffer(_simgui.ibuf, &idx_data);
    }

    /* render the ImGui command list */
    const float dpi_scale = _simgui.desc.dpi_scale;
    const int fb_width = (int) (io->DisplaySize.x * dpi_scale);
    const int fb_height = (int) (io->DisplaySize.y * dpi_scale);
    sg_apply_viewport(0, 0, fb_width, fb_height, true);
    sg_apply_scissor_rect(0, 0, fb_width, fb_height, true);

    sg_apply_pipeline(_simgui.pip);
    _simgui_vs_params_t vs_params;
    memset((void*)&vs_params, 0, sizeof(vs_params));
    vs_params.disp_size.x = io->DisplaySize.x;
    vs_params.disp_size.y = io->DisplaySize.y;
    sg_apply_uniforms(SG_SHADERSTAGE_VS, 0, SG_RANGE_REF(vs_params));
    sg_bindings bind;
    memset((void*)&bind, 0, sizeof(bind));
    bind.vertex_buffers[0] = _simgui.vbuf;
    bind.index_buffer = _simgui.ibuf;
    ImTextureID tex_id = io->Fonts->TexID;
    bind.fs_images[0].id = (uint32_t)(uintptr_t)tex_id;
    int vb_offset = 0;
    int ib_offset = 0;
    for (int cl_index = 0; cl_index < cmd_list_count; cl_index++) {
        const ImDrawList* cl = draw_data->CmdLists[cl_index];

        bind.vertex_buffer_offsets[0] = vb_offset;
        bind.index_buffer_offset = ib_offset;
        sg_apply_bindings(&bind);

        int base_element = 0;
        #if defined(__cplusplus)
            const int num_cmds = cl->CmdBuffer.size();
        #else
            const int num_cmds = cl->CmdBuffer.Size;
        #endif
        uint32_t vtx_offset = 0;
        for (int cmd_index = 0; cmd_index < num_cmds; cmd_index++) {
            ImDrawCmd* pcmd = &cl->CmdBuffer.Data[cmd_index];
            if (pcmd->UserCallback) {
                pcmd->UserCallback(cl, pcmd);
                // need to re-apply all state after calling a user callback
                sg_apply_viewport(0, 0, fb_width, fb_height, true);
                sg_apply_pipeline(_simgui.pip);
                sg_apply_uniforms(SG_SHADERSTAGE_VS, 0, SG_RANGE_REF(vs_params));
                sg_apply_bindings(&bind);
            }
            else {
                if ((tex_id != pcmd->TextureId) || (vtx_offset != pcmd->VtxOffset)) {
                    tex_id = pcmd->TextureId;
                    vtx_offset = pcmd->VtxOffset;
                    bind.fs_images[0].id = (uint32_t)(uintptr_t)tex_id;
                    bind.vertex_buffer_offsets[0] = vb_offset + (int)(pcmd->VtxOffset * sizeof(ImDrawVert));
                    sg_apply_bindings(&bind);
                }
                const int scissor_x = (int) (pcmd->ClipRect.x * dpi_scale);
                const int scissor_y = (int) (pcmd->ClipRect.y * dpi_scale);
                const int scissor_w = (int) ((pcmd->ClipRect.z - pcmd->ClipRect.x) * dpi_scale);
                const int scissor_h = (int) ((pcmd->ClipRect.w - pcmd->ClipRect.y) * dpi_scale);
                sg_apply_scissor_rect(scissor_x, scissor_y, scissor_w, scissor_h, true);
                sg_draw(base_element, (int)pcmd->ElemCount, 1);
            }
            base_element += (int)pcmd->ElemCount;
        }
        #if defined(__cplusplus)
            const size_t vtx_size = cl->VtxBuffer.size() * sizeof(ImDrawVert);
            const size_t idx_size = cl->IdxBuffer.size() * sizeof(ImDrawIdx);
        #else
            const size_t vtx_size = (size_t)cl->VtxBuffer.Size * sizeof(ImDrawVert);
            const size_t idx_size = (size_t)cl->IdxBuffer.Size * sizeof(ImDrawIdx);
        #endif
        vb_offset += (int)vtx_size;
        ib_offset += (int)idx_size;
    }
    sg_apply_viewport(0, 0, fb_width, fb_height, true);
    sg_apply_scissor_rect(0, 0, fb_width, fb_height, true);
    sg_pop_debug_group();
}